

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O0

ostream * __thiscall
inja::Environment::render_to(Environment *this,ostream *os,Template *tmpl,json *data)

{
  Renderer local_170;
  json *local_28;
  json *data_local;
  Template *tmpl_local;
  ostream *os_local;
  Environment *this_local;
  
  local_28 = data;
  data_local = (json *)tmpl;
  tmpl_local = (Template *)os;
  os_local = (ostream *)this;
  Renderer::Renderer(&local_170,&this->render_config,&this->template_storage,&this->function_storage
                    );
  Renderer::render_to(&local_170,(ostream *)tmpl_local,(Template *)data_local,local_28,(json *)0x0);
  Renderer::~Renderer(&local_170);
  return (ostream *)tmpl_local;
}

Assistant:

std::ostream& render_to(std::ostream& os, const Template& tmpl, const json& data) {
    Renderer(render_config, template_storage, function_storage).render_to(os, tmpl, data);
    return os;
  }